

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_lz4.c
# Opt level: O0

int archive_filter_lz4_open(archive_write_filter *f)

{
  int iVar1;
  undefined1 auStack_30 [4];
  int r;
  archive_string as;
  private_data_conflict6 *data;
  archive_write_filter *f_local;
  
  as.buffer_length = (size_t)f->data;
  _auStack_30 = (char *)0x0;
  as.length = 0;
  as.s = (char *)0x0;
  archive_strncat((archive_string *)auStack_30,"lz4 -z -q -q",0xc);
  if (0 < *(int *)as.buffer_length) {
    archive_strcat((archive_string *)auStack_30," -");
    archive_strappend_char((archive_string *)auStack_30,(char)*(undefined4 *)as.buffer_length + '0')
    ;
  }
  archive_strcat((archive_string *)auStack_30," -B");
  archive_strappend_char
            ((archive_string *)auStack_30,
             ((byte)(*(ushort *)(as.buffer_length + 4) >> 7) & 7) + 0x30);
  if ((*(ushort *)(as.buffer_length + 4) >> 3 & 1) != 0) {
    archive_strcat((archive_string *)auStack_30," -BX");
  }
  if ((*(ushort *)(as.buffer_length + 4) >> 5 & 1) == 0) {
    archive_strcat((archive_string *)auStack_30," --no-frame-crc");
  }
  if ((*(ushort *)(as.buffer_length + 4) >> 2 & 1) == 0) {
    archive_strcat((archive_string *)auStack_30," -BD");
  }
  f->write = archive_filter_lz4_write;
  iVar1 = __archive_write_program_open
                    (f,*(archive_write_program_data **)(as.buffer_length + 8),_auStack_30);
  archive_string_free((archive_string *)auStack_30);
  return iVar1;
}

Assistant:

static int
archive_filter_lz4_open(struct archive_write_filter *f)
{
	struct private_data *data = (struct private_data *)f->data;
	struct archive_string as;
	int r;

	archive_string_init(&as);
	archive_strcpy(&as, "lz4 -z -q -q");

	/* Specify a compression level. */
	if (data->compression_level > 0) {
		archive_strcat(&as, " -");
		archive_strappend_char(&as, '0' + data->compression_level);
	}
	/* Specify a block size. */
	archive_strcat(&as, " -B");
	archive_strappend_char(&as, '0' + data->block_maximum_size);

	if (data->block_checksum)
		archive_strcat(&as, " -BX");
	if (data->stream_checksum == 0)
		archive_strcat(&as, " --no-frame-crc");
	if (data->block_independence == 0)
		archive_strcat(&as, " -BD");

	f->write = archive_filter_lz4_write;

	r = __archive_write_program_open(f, data->pdata, as.s);
	archive_string_free(&as);
	return (r);
}